

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O2

QList<QBenchmarkMeasurerBase::Measurement> * __thiscall
QBenchmarkCallgrindMeasurer::stop
          (QList<QBenchmarkMeasurerBase::Measurement> *__return_storage_ptr__,
          QBenchmarkCallgrindMeasurer *this)

{
  long lVar1;
  qint64 qVar2;
  long in_FS_OFFSET;
  initializer_list<QBenchmarkMeasurerBase::Measurement> args;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _zzq_args[0] = 0x43540000;
  _zzq_args[1] = 0;
  _zzq_args[2] = 0;
  _zzq_args[3] = 0;
  _zzq_args[4] = 0;
  _zzq_args[5] = 0;
  qVar2 = QBenchmarkValgrindUtils::extractLastResult();
  _zzq_args[0] = (unsigned_long)(double)qVar2;
  _zzq_args[1] = CONCAT44(_zzq_args[1]._4_4_,5);
  args._M_len = 1;
  args._M_array = (iterator)_zzq_args;
  QList<QBenchmarkMeasurerBase::Measurement>::QList(__return_storage_ptr__,args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QBenchmarkMeasurerBase::Measurement> QBenchmarkCallgrindMeasurer::stop()
{
    CALLGRIND_DUMP_STATS;
    const qint64 result = QBenchmarkValgrindUtils::extractLastResult();
    return { { qreal(result), QTest::InstructionReads } };
}